

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dws.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *str,string *delim)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = str->_M_string_length;
  if (uVar2 != 0) {
    uVar3 = 0;
LAB_001034dc:
    do {
      if (uVar3 < uVar2) {
        lVar1 = std::__cxx11::string::find
                          ((char)delim,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar3]);
        uVar2 = str->_M_string_length;
        if (lVar1 != -1) {
          uVar3 = uVar3 + 1;
          goto LAB_001034dc;
        }
      }
      uVar4 = uVar3;
      if (uVar3 < uVar2) {
        do {
          lVar1 = std::__cxx11::string::find
                            ((char)delim,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar4]);
          if (lVar1 != -1) break;
          uVar4 = uVar4 + 1;
        } while (uVar4 < str->_M_string_length);
        if (uVar4 - uVar3 != 0) {
          std::__cxx11::string::string((string *)&local_50,(string *)str,uVar3,uVar4 - uVar3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      uVar3 = uVar4;
      uVar2 = str->_M_string_length;
    } while (uVar3 < uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> split(const string& str, const string& delim)
{
	vector<string> parts;
	size_t start;
	size_t end = 0;
	while (end < str.size())
	{
		start = end;
		while (start < str.size() && (delim.find(str[start]) != string::npos))
			start++; // skip initial whitespace
		end = start;
		while (end < str.size() && (delim.find(str[end]) == string::npos))
			end++; // skip to end of word
		if (end - start != 0) // just ignore zero-length strings.
			parts.push_back(string(str, start, end - start));
	}
	return parts;
}